

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

int do_dsa_print(BIO *bp,DSA *x,int off,int ptype)

{
  int iVar1;
  uint uVar2;
  BIGNUM *a;
  BIGNUM *pBVar3;
  char *local_40;
  char *ktype;
  BIGNUM *pub_key;
  BIGNUM *priv_key;
  int ptype_local;
  int off_local;
  DSA *x_local;
  BIO *bp_local;
  
  pub_key = (BIGNUM *)0x0;
  if (ptype == 2) {
    pub_key = DSA_get0_priv_key(x);
  }
  ktype = (char *)0x0;
  if (0 < ptype) {
    ktype = (char *)DSA_get0_pub_key(x);
  }
  local_40 = "DSA-Parameters";
  if (ptype == 2) {
    local_40 = "Private-Key";
  }
  else if (ptype == 1) {
    local_40 = "Public-Key";
  }
  iVar1 = BIO_indent((BIO *)bp,off,0x80);
  if (iVar1 != 0) {
    a = (BIGNUM *)DSA_get0_p(x);
    uVar2 = BN_num_bits(a);
    iVar1 = BIO_printf((BIO *)bp,"%s: (%u bit)\n",local_40,(ulong)uVar2);
    if (((0 < iVar1) && (iVar1 = bn_print(bp,"priv:",pub_key,off), iVar1 != 0)) &&
       (iVar1 = bn_print(bp,"pub:",(BIGNUM *)ktype,off), iVar1 != 0)) {
      pBVar3 = DSA_get0_p(x);
      iVar1 = bn_print(bp,"P:",pBVar3,off);
      if (iVar1 != 0) {
        pBVar3 = DSA_get0_q(x);
        iVar1 = bn_print(bp,"Q:",pBVar3,off);
        if (iVar1 != 0) {
          pBVar3 = DSA_get0_g(x);
          iVar1 = bn_print(bp,"G:",pBVar3,off);
          if (iVar1 != 0) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int do_dsa_print(BIO *bp, const DSA *x, int off, int ptype) {
  const BIGNUM *priv_key = NULL;
  if (ptype == 2) {
    priv_key = DSA_get0_priv_key(x);
  }

  const BIGNUM *pub_key = NULL;
  if (ptype > 0) {
    pub_key = DSA_get0_pub_key(x);
  }

  const char *ktype = "DSA-Parameters";
  if (ptype == 2) {
    ktype = "Private-Key";
  } else if (ptype == 1) {
    ktype = "Public-Key";
  }

  if (!BIO_indent(bp, off, 128) ||
      BIO_printf(bp, "%s: (%u bit)\n", ktype, BN_num_bits(DSA_get0_p(x))) <=
          0 ||
      // |priv_key| and |pub_key| may be NULL, in which case |bn_print| will
      // silently skip them.
      !bn_print(bp, "priv:", priv_key, off) ||
      !bn_print(bp, "pub:", pub_key, off) ||
      !bn_print(bp, "P:", DSA_get0_p(x), off) ||
      !bn_print(bp, "Q:", DSA_get0_q(x), off) ||
      !bn_print(bp, "G:", DSA_get0_g(x), off)) {
    return 0;
  }

  return 1;
}